

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
wabt::Opcode::GetBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Opcode *this)

{
  bool bVar1;
  uint32_t uVar2;
  Offset OVar3;
  uint8_t buffer [5];
  uchar local_1f;
  uint8_t local_1e;
  uint8_t local_1d [5];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = HasPrefix(this);
  if (bVar1) {
    local_1e = GetPrefix(this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_1e);
    uVar2 = GetCode(this);
    OVar3 = WriteU32Leb128Raw(local_1d,&stack0xffffffffffffffe8,uVar2);
    if (OVar3 == 0) {
      __assert_fail("length != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/opcode.cc"
                    ,0x17c,"std::vector<uint8_t> wabt::Opcode::GetBytes() const");
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_1d,local_1d + OVar3);
  }
  else {
    uVar2 = GetCode(this);
    local_1f = (uchar)uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_1f);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Opcode::GetBytes() const {
  std::vector<uint8_t> result;
  if (HasPrefix()) {
    result.push_back(GetPrefix());
    uint8_t buffer[5];
    Offset length =
        WriteU32Leb128Raw(buffer, buffer + sizeof(buffer), GetCode());
    assert(length != 0);
    result.insert(result.end(), buffer, buffer + length);
  } else {
    result.push_back(GetCode());
  }
  return result;
}